

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O2

void __thiscall AddrManImpl::SetServices_(AddrManImpl *this,CService *addr,ServiceFlags nServices)

{
  long lVar1;
  AddrInfo *pAVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pAVar2 = Find(this,addr,(nid_type *)0x0);
  if (pAVar2 != (AddrInfo *)0x0) {
    (pAVar2->super_CAddress).nServices = nServices;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void AddrManImpl::SetServices_(const CService& addr, ServiceFlags nServices)
{
    AssertLockHeld(cs);

    AddrInfo* pinfo = Find(addr);

    // if not found, bail out
    if (!pinfo)
        return;

    AddrInfo& info = *pinfo;

    // update info
    info.nServices = nServices;
}